

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_DRBG.c
# Opt level: O2

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)

{
  if ((byte)(a - 1) < 4) {
    return *(uint32_t *)(&DAT_001b30a0 + (ulong)(byte)(a - 1) * 4);
  }
  fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_HMAC_DRBG.c"
          ,0x41);
  exit(0xfd);
}

Assistant:

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        return 16U;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return 32U;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}